

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::GetBooleanValue(cmConditionEvaluator *this,cmExpandedCommandArgument *arg)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  char *def;
  double d;
  char *end;
  cmExpandedCommandArgument *arg_local;
  cmConditionEvaluator *this_local;
  
  end = (char *)arg;
  arg_local = (cmExpandedCommandArgument *)this;
  bVar1 = cmExpandedCommandArgument::operator==(arg,"0");
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = cmExpandedCommandArgument::operator==((cmExpandedCommandArgument *)end,"1");
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      pcVar2 = cmExpandedCommandArgument::c_str((cmExpandedCommandArgument *)end);
      bVar1 = cmSystemTools::IsOn(pcVar2);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        pcVar2 = cmExpandedCommandArgument::c_str((cmExpandedCommandArgument *)end);
        bVar1 = cmSystemTools::IsOff(pcVar2);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          bVar1 = cmExpandedCommandArgument::empty((cmExpandedCommandArgument *)end);
          if (!bVar1) {
            pcVar2 = cmExpandedCommandArgument::c_str((cmExpandedCommandArgument *)end);
            dVar3 = strtod(pcVar2,(char **)&d);
            if (*(char *)d == '\0') {
              return dVar3 != 0.0;
            }
          }
          pcVar2 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)end);
          bVar1 = cmSystemTools::IsOff(pcVar2);
          this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValue(
  cmExpandedCommandArgument& arg) const
{
  // Check basic constants.
  if (arg == "0") {
    return false;
  }
  if (arg == "1") {
    return true;
  }

  // Check named constants.
  if (cmSystemTools::IsOn(arg.c_str())) {
    return true;
  }
  if (cmSystemTools::IsOff(arg.c_str())) {
    return false;
  }

  // Check for numbers.
  if (!arg.empty()) {
    char* end;
    double d = strtod(arg.c_str(), &end);
    if (*end == '\0') {
      // The whole string is a number.  Use C conversion to bool.
      return static_cast<bool>(d);
    }
  }

  // Check definition.
  const char* def = this->GetDefinitionIfUnquoted(arg);
  return !cmSystemTools::IsOff(def);
}